

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O1

void Dam_ManUpdate(Dam_Man_t *p,int iDiv)

{
  int *piVar1;
  uint iLit0;
  int iVar2;
  Vec_Int_t *pVVar3;
  Gia_Man_t *pGVar4;
  Gia_Obj_t *pGVar5;
  Vec_Flt_t *pVVar6;
  Vec_Int_t *pVVar7;
  int iVar8;
  int iVar9;
  Gia_Obj_t *pFanout;
  ulong uVar10;
  float *pfVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  int *piVar22;
  int local_64;
  
  if (iDiv < 0) {
LAB_006fe64d:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  pVVar3 = p->vHash->vObjs;
  uVar14 = iDiv * 4;
  if (pVVar3->nSize <= (int)uVar14) goto LAB_006fe64d;
  pGVar4 = p->pGia;
  piVar22 = pVVar3->pArray;
  uVar12 = 0;
  if (iDiv < p->vDiv2Nod->nSize) {
    uVar12 = p->vDiv2Nod->pArray[(uint)iDiv];
  }
  iLit0 = piVar22[uVar14];
  uVar14 = piVar22[(ulong)uVar14 + 1];
  pVVar3 = pGVar4->vSuper;
  if (uVar12 == 0) {
    piVar22 = (int *)0x0;
  }
  else {
    if (((int)uVar12 < 0) || (p->vNodStore->nSize <= (int)uVar12)) goto LAB_006fe64d;
    piVar22 = p->vNodStore->pArray + uVar12;
  }
  pFanout = Gia_ManAppendObj(pGVar4);
  iVar19 = (int)pFanout;
  if ((int)uVar14 < (int)iLit0) {
    if ((int)iLit0 < 0) {
LAB_006fe707:
      __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2d4,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
    }
    uVar12 = iLit0 >> 1;
    iVar2 = pGVar4->nObjs;
    if (iVar2 <= (int)uVar12) goto LAB_006fe707;
    if (((int)uVar14 < 0) || (uVar17 = uVar14 >> 1, iVar2 <= (int)uVar17)) {
      __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2d5,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
    }
    if (uVar12 == uVar17) {
      __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2d6,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
    }
    pGVar5 = pGVar4->pObjs;
    if (uVar17 < uVar12) {
      if (pGVar5 + iVar2 <= pFanout || pFanout < pGVar5) goto LAB_006fe6e8;
      uVar13 = *(ulong *)pFanout;
      uVar21 = (ulong)((iLit0 & 1) << 0x1d |
                      ((uint)(iVar19 - (int)pGVar5) >> 2) * -0x55555555 - uVar12 & 0x1fffffff);
      *(ulong *)pFanout = uVar21 | uVar13 & 0xffffffffc0000000;
      pGVar5 = pGVar4->pObjs;
      if ((pFanout < pGVar5) || (pGVar5 + pGVar4->nObjs <= pFanout)) goto LAB_006fe6e8;
      uVar15 = (ulong)(((uint)(iVar19 - (int)pGVar5) >> 2) * -0x55555555 - uVar17 & 0x1fffffff) <<
               0x20;
      *(ulong *)pFanout = uVar21 | uVar13 & 0xe0000000c0000000 | uVar15;
      uVar10 = (ulong)(uVar14 & 1) << 0x3d;
      uVar15 = uVar21 | uVar13 & 0xc0000000c0000000 | uVar15;
    }
    else {
      if (pGVar5 + iVar2 <= pFanout || pFanout < pGVar5) goto LAB_006fe6e8;
      uVar16 = (ulong)(((uint)(iVar19 - (int)pGVar5) >> 2) * -0x55555555 - uVar12 & 0x1fffffff) <<
               0x20;
      uVar13 = *(ulong *)pFanout;
      uVar21 = (ulong)(iLit0 & 1) << 0x3d;
      *(ulong *)pFanout = uVar21 | uVar13 & 0xc0000000ffffffff | uVar16;
      pGVar5 = pGVar4->pObjs;
      if ((pFanout < pGVar5) || (pGVar5 + pGVar4->nObjs <= pFanout)) goto LAB_006fe6e8;
      uVar15 = (ulong)(((uint)(iVar19 - (int)pGVar5) >> 2) * -0x55555555 - uVar17 & 0x1fffffff);
      *(ulong *)pFanout = uVar21 | uVar13 & 0xc0000000e0000000 | uVar16 | uVar15;
      uVar10 = (ulong)((uVar14 & 1) << 0x1d);
      uVar15 = uVar21 | uVar13 & 0xc0000000c0000000 | uVar16 | uVar15;
    }
    *(ulong *)pFanout = uVar15 | uVar10;
    pGVar4->nXors = pGVar4->nXors + 1;
  }
  else {
    if ((int)iLit0 < 0) {
LAB_006fe726:
      __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2a8,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
    }
    uVar12 = iLit0 >> 1;
    iVar2 = pGVar4->nObjs;
    if (iVar2 <= (int)uVar12) goto LAB_006fe726;
    if (((int)uVar14 < 0) || (uVar17 = uVar14 >> 1, iVar2 <= (int)uVar17)) {
      __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2a9,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
    }
    if ((uVar12 == uVar17) && (pGVar4->fGiaSimple == 0)) {
      __assert_fail("p->fGiaSimple || Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x2aa,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
    }
    pGVar5 = pGVar4->pObjs;
    if ((int)iLit0 < (int)uVar14) {
      if (pGVar5 + iVar2 <= pFanout || pFanout < pGVar5) goto LAB_006fe6e8;
      uVar13 = *(ulong *)pFanout;
      uVar21 = (ulong)((iLit0 & 1) << 0x1d |
                      ((uint)(iVar19 - (int)pGVar5) >> 2) * -0x55555555 - uVar12 & 0x1fffffff);
      *(ulong *)pFanout = uVar21 | uVar13 & 0xffffffffc0000000;
      pGVar5 = pGVar4->pObjs;
      if ((pFanout < pGVar5) || (pGVar5 + pGVar4->nObjs <= pFanout)) goto LAB_006fe6e8;
      uVar15 = (ulong)(((uint)(iVar19 - (int)pGVar5) >> 2) * -0x55555555 - uVar17 & 0x1fffffff) <<
               0x20;
      *(ulong *)pFanout = uVar21 | uVar13 & 0xe0000000c0000000 | uVar15;
      uVar10 = (ulong)(uVar14 & 1) << 0x3d;
      uVar15 = uVar21 | uVar13 & 0xc0000000c0000000 | uVar15;
    }
    else {
      if (pGVar5 + iVar2 <= pFanout || pFanout < pGVar5) goto LAB_006fe6e8;
      uVar16 = (ulong)(((uint)(iVar19 - (int)pGVar5) >> 2) * -0x55555555 - uVar12 & 0x1fffffff) <<
               0x20;
      uVar13 = *(ulong *)pFanout;
      uVar21 = (ulong)(iLit0 & 1) << 0x3d;
      *(ulong *)pFanout = uVar21 | uVar13 & 0xc0000000ffffffff | uVar16;
      pGVar5 = pGVar4->pObjs;
      if ((pFanout < pGVar5) || (pGVar5 + pGVar4->nObjs <= pFanout)) goto LAB_006fe6e8;
      uVar15 = (ulong)(((uint)(iVar19 - (int)pGVar5) >> 2) * -0x55555555 - uVar17 & 0x1fffffff);
      *(ulong *)pFanout = uVar21 | uVar13 & 0xc0000000e0000000 | uVar16 | uVar15;
      uVar10 = (ulong)((uVar14 & 1) << 0x1d);
      uVar15 = uVar21 | uVar13 & 0xc0000000c0000000 | uVar16 | uVar15;
    }
    *(ulong *)pFanout = uVar15 | uVar10;
    if (pGVar4->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(pGVar4,pFanout + -(uVar15 & 0x1fffffff),pFanout);
      Gia_ObjAddFanout(pGVar4,pFanout + -((ulong)*(uint *)&pFanout->field_0x4 & 0x1fffffff),pFanout)
      ;
    }
    if (pGVar4->fSweeper != 0) {
      uVar21 = *(ulong *)pFanout & 0x1fffffff;
      uVar13 = *(ulong *)pFanout >> 0x20 & 0x1fffffff;
      uVar16 = 0x4000000000000000;
      uVar10 = 0x4000000000000000;
      if (((uint)*(ulong *)(pFanout + -uVar21) >> 0x1e & 1) == 0) {
        uVar10 = 0x40000000;
      }
      *(ulong *)(pFanout + -uVar21) = uVar10 | *(ulong *)(pFanout + -uVar21);
      uVar10 = *(ulong *)(pFanout + -uVar13);
      if (((uint)uVar10 >> 0x1e & 1) == 0) {
        uVar16 = 0x40000000;
      }
      *(ulong *)(pFanout + -uVar13) = uVar16 | uVar10;
      uVar13 = *(ulong *)pFanout;
      *(ulong *)pFanout =
           uVar13 & 0x7fffffffffffffff |
           (ulong)(((uint)(uVar13 >> 0x3d) ^ (uint)(uVar10 >> 0x3f)) &
                  ((uint)((ulong)*(undefined8 *)(pFanout + -uVar21) >> 0x3f) ^
                  (uint)(uVar13 >> 0x1d) & 7)) << 0x3f;
    }
    if (pGVar4->fBuiltInSim != 0) {
      uVar13 = *(ulong *)pFanout;
      *(ulong *)pFanout =
           uVar13 & 0x7fffffffffffffff |
           (ulong)(((uint)(uVar13 >> 0x3d) ^
                   (uint)((ulong)*(undefined8 *)(pFanout + -(uVar13 >> 0x20 & 0x1fffffff)) >> 0x3f))
                  & ((uint)((ulong)*(undefined8 *)(pFanout + -(uVar13 & 0x1fffffff)) >> 0x3f) ^
                    (uint)(uVar13 >> 0x1d) & 7)) << 0x3f;
      pGVar5 = pGVar4->pObjs;
      if ((pFanout < pGVar5) || (pGVar5 + pGVar4->nObjs <= pFanout)) goto LAB_006fe6e8;
      Gia_ManBuiltInSimPerform
                (pGVar4,(int)((ulong)((long)pFanout - (long)pGVar5) >> 2) * -0x55555555);
    }
    if (pGVar4->vSuppWords != (Vec_Wrd_t *)0x0) {
      Gia_ManQuantSetSuppAnd(pGVar4,pFanout);
    }
  }
  pGVar5 = pGVar4->pObjs;
  if ((pFanout < pGVar5) || (pGVar5 + pGVar4->nObjs <= pFanout)) {
LAB_006fe6e8:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar19 = (int)((long)pFanout - (long)pGVar5 >> 2);
  uVar12 = iVar19 * -0x55555555;
  iVar19 = iVar19 * 0x55555556;
  if (iVar19 < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  pGVar4 = p->pGia;
  if (pGVar4->nObjs <= (int)(uVar12 & 0x7fffffff)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  Gia_ObjSetGateLevel(pGVar4,pGVar4->pObjs + (uVar12 & 0x7fffffff));
  if (*piVar22 < 2) {
    __assert_fail("pNods[0] >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                  ,0x3b9,"void Dam_ManUpdate(Dam_Man_t *, int)");
  }
  iVar2 = p->vHash->vObjs->nSize;
  iVar18 = iVar2 + 3;
  if (-1 < iVar2) {
    iVar18 = iVar2;
  }
  pVVar3->nSize = 0;
  if (*piVar22 < 1) {
    local_64 = -1;
  }
  else {
    lVar20 = 0;
    local_64 = 0;
    do {
      iVar8 = Dam_ManUpdateNode(p,piVar22[lVar20 + 1],iLit0,uVar14,iVar19,pVVar3);
      local_64 = local_64 + iVar8;
      lVar20 = lVar20 + 1;
    } while (lVar20 < *piVar22);
    local_64 = local_64 + -1;
  }
  uVar12 = iVar18 >> 2;
  uVar13 = (ulong)uVar12;
  iVar19 = p->vHash->vObjs->nSize;
  iVar18 = iVar19 + 3;
  if (-1 < iVar19) {
    iVar18 = iVar19;
  }
  pVVar6 = p->vCounts;
  iVar18 = iVar18 >> 2;
  if (iVar18 <= pVVar6->nSize) goto LAB_006fe3b3;
  iVar19 = pVVar6->nCap;
  iVar8 = iVar19 * 2;
  if (iVar8 < iVar18) {
    if (iVar19 < iVar18) {
      if (pVVar6->pArray == (float *)0x0) {
        pfVar11 = (float *)malloc((long)iVar18 << 2);
      }
      else {
        pfVar11 = (float *)realloc(pVVar6->pArray,(long)iVar18 << 2);
      }
      pVVar6->pArray = pfVar11;
      iVar8 = iVar18;
LAB_006fe382:
      pVVar6->nCap = iVar8;
    }
  }
  else if (iVar19 < iVar8 && iVar19 < iVar18) {
    if (pVVar6->pArray == (float *)0x0) {
      pfVar11 = (float *)malloc((long)iVar19 << 3);
    }
    else {
      pfVar11 = (float *)realloc(pVVar6->pArray,(long)iVar19 << 3);
    }
    pVVar6->pArray = pfVar11;
    goto LAB_006fe382;
  }
  uVar17 = pVVar6->nSize;
  if ((int)uVar17 < iVar18) {
    memset(pVVar6->pArray + (int)uVar17,0,(ulong)(~uVar17 + iVar18) * 4 + 4);
  }
  pVVar6->nSize = iVar18;
LAB_006fe3b3:
  Vec_IntFillExtra(p->vDiv2Nod,iVar18,-1);
  if ((int)uVar12 < iVar18) {
    uVar17 = uVar12 * 4;
    uVar21 = uVar13;
    do {
      if ((iVar2 < -3) || (pVVar7 = p->vHash->vObjs, pVVar7->nSize <= (int)uVar17))
      goto LAB_006fe64d;
      piVar22 = pVVar7->pArray;
      iVar19 = piVar22[(ulong)uVar17 + 2];
      if (1 < iVar19) {
        iVar8 = (int)uVar21;
        if (p->vDivLevR->nSize <= iVar8) goto LAB_006fe66c;
        pVVar6 = p->vCounts;
        iVar9 = Dam_ManDivSlack(p,piVar22[uVar17],piVar22[(ulong)uVar17 + 1],
                                p->vDivLevR->pArray[uVar21]);
        if (pVVar6->nSize <= iVar8) goto LAB_006fe6aa;
        pVVar6->pArray[uVar21] = (float)iVar9 * 0.001 + (float)iVar19;
        Vec_QuePush(p->vQue,iVar8);
        if (p->vDiv2Nod->nSize <= iVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pVVar7 = p->vNodStore;
        p->vDiv2Nod->pArray[uVar21] = pVVar7->nSize;
        Vec_IntPush(pVVar7,0);
        Vec_IntFillExtra(p->vNodStore,iVar19 + p->vNodStore->nSize,-1);
      }
      uVar21 = uVar21 + 1;
      uVar17 = uVar17 + 4;
    } while ((int)uVar21 < iVar18);
  }
  if (0 < pVVar3->nSize) {
    piVar22 = pVVar3->pArray;
    iVar19 = -1;
    lVar20 = 0;
    do {
      iVar8 = piVar22[lVar20];
      if ((long)iVar8 < 0) {
        iVar19 = -iVar8;
      }
      else {
        if (p->vDiv2Nod->nSize <= iVar8) goto LAB_006fe66c;
        uVar17 = p->vDiv2Nod->pArray[iVar8];
        if ((ulong)uVar17 != 0xffffffff) {
          if (((int)uVar17 < 0) || (p->vNodStore->nSize <= (int)uVar17)) goto LAB_006fe64d;
          piVar1 = p->vNodStore->pArray + uVar17;
          iVar8 = *piVar1;
          *piVar1 = iVar8 + 1;
          piVar1[(long)iVar8 + 1] = iVar19;
        }
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < pVVar3->nSize);
  }
  if ((int)uVar12 < iVar18) {
    uVar12 = uVar12 << 2;
    do {
      if ((iVar2 < -3) || (p->vDiv2Nod->nSize <= (int)uVar13)) {
LAB_006fe66c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar19 = p->vDiv2Nod->pArray[uVar13];
      if (0 < (long)iVar19) {
        if ((p->vNodStore->nSize <= iVar19) ||
           (pVVar3 = p->vHash->vObjs, pVVar3->nSize <= (int)uVar12)) goto LAB_006fe64d;
        if (p->vNodStore->pArray[iVar19] != pVVar3->pArray[(ulong)uVar12 + 2]) {
          __assert_fail("Dam_DivSet(p, i)[0] == Hash_IntObjData2(p->vHash, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaBalAig.c"
                        ,0x3e2,"void Dam_ManUpdate(Dam_Man_t *, int)");
        }
      }
      uVar13 = uVar13 + 1;
      uVar12 = uVar12 + 4;
    } while ((int)uVar13 < iVar18);
  }
  if (iDiv < p->vCounts->nSize) {
    p->vCounts->pArray[(uint)iDiv] = 0.0;
    p->nGain = p->nGain + ((uint)((int)uVar14 < (int)iLit0) * 2 + 1) * local_64;
    p->nGainX = p->nGainX + (uint)((int)uVar14 < (int)iLit0) * local_64 * 3;
    p->nDivs = p->nDivs + 1;
    return;
  }
LAB_006fe6aa:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
}

Assistant:

void Dam_ManUpdate( Dam_Man_t * p, int iDiv )
{
    Vec_Int_t * vDivs = p->pGia->vSuper;
    int iLit0 = Hash_IntObjData0(p->vHash, iDiv);
    int iLit1 = Hash_IntObjData1(p->vHash, iDiv);
    int i, iLitNew, * pSet, * pNods = Dam_DivSet( p, iDiv );
    int nPresent = 0, nPairsStart, nPairsStop, pPairsNew, nRefs;
    int fThisIsXor = (iLit0 > iLit1), iDivTemp, iNode;
//    Dam_PrintQue( p );
    if ( fThisIsXor )
        iLitNew = Gia_ManAppendXorReal( p->pGia, iLit0, iLit1 );
    else
        iLitNew = Gia_ManAppendAnd( p->pGia, iLit0, iLit1 );
    Gia_ObjSetGateLevel( p->pGia, Gia_ManObj(p->pGia, Abc_Lit2Var(iLitNew)) );
//    printf( "%d ", Gia_ObjLevel(p->pGia, Gia_ManObj(p->pGia, Abc_Lit2Var(iLitNew))) );
    // replace entries
    assert( pNods[0] >= 2 );
    nPairsStart = Hash_IntManEntryNum(p->vHash) + 1;
    Vec_IntClear( vDivs );
    for ( i = 1; i <= pNods[0]; i++ )
        nPresent += Dam_ManUpdateNode( p, pNods[i], iLit0, iLit1, iLitNew, vDivs );
    nPairsStop = Hash_IntManEntryNum(p->vHash) + 1;
    // extend arrayvs
    pPairsNew = 0;
    Vec_FltFillExtra( p->vCounts, nPairsStop, 0 );
    Vec_IntFillExtra( p->vDiv2Nod, nPairsStop, -1 );
    for ( i = nPairsStart; i < nPairsStop; i++ )
    {
        nRefs = Hash_IntObjData2(p->vHash, i);
        if ( nRefs < 2 )
            continue;
        Vec_FltWriteEntry( p->vCounts, i, nRefs + 0.001*Dam_ManDivSlack(p, Hash_IntObjData0(p->vHash, i), Hash_IntObjData1(p->vHash, i), Vec_IntEntry(p->vDivLevR, i)) );
        Vec_QuePush( p->vQue, i );
        // remember divisors
        Vec_IntWriteEntry( p->vDiv2Nod, i, Vec_IntSize(p->vNodStore) );
        Vec_IntPush( p->vNodStore, 0 );
        Vec_IntFillExtra( p->vNodStore, Vec_IntSize(p->vNodStore) + nRefs, -1 );
        pPairsNew++;
    }
//    printf( "Added %d new pairs\n", pPairsNew );
    // fill in the divisors
    iNode = -1;
    Vec_IntForEachEntry( vDivs, iDivTemp, i )
    {
        if ( iDivTemp < 0 )
        {
            iNode = -iDivTemp;
            continue;
        }
        if ( Vec_IntEntry(p->vDiv2Nod, iDivTemp) == -1 )
            continue;
        pSet = Dam_DivSet( p, iDivTemp );
        pSet[++pSet[0]] = iNode;
    }
    // make sure divisors are added correctly
    for ( i = nPairsStart; i < nPairsStop; i++ )
        if ( Vec_IntEntry(p->vDiv2Nod, i) > 0 )
            assert( Dam_DivSet(p, i)[0] == Hash_IntObjData2(p->vHash, i) );
    // update costs
    Vec_FltWriteEntry( p->vCounts, iDiv, 0 );
    p->nGain += (1 + 2 * fThisIsXor) * (nPresent - 1);
    p->nGainX += 3 * fThisIsXor * (nPresent - 1);
    p->nDivs++;
}